

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O1

Vec_Int_t * Mio_ParseFormula(char *pFormInit,char **ppVarNames,int nVars)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  FILE *pFVar9;
  char *pcVar10;
  size_t sVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  int iVar14;
  int Entry;
  FILE *pFVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  char cVar19;
  char cVar20;
  long lVar21;
  bool bVar22;
  Vec_Int_t *pStackOp;
  Vec_Ptr_t *pStackFn;
  FILE *local_68;
  Vec_Ptr_t *local_60;
  int local_58;
  uint local_54;
  byte *local_50;
  ulong local_48;
  long local_40;
  char **local_38;
  
  local_48 = (ulong)(uint)nVars;
  iVar4 = 0;
  pcVar16 = pFormInit;
  do {
    cVar20 = *pcVar16;
    if (cVar20 == '(') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar20 == ')') {
      iVar4 = iVar4 + -1;
    }
    else if (cVar20 == '\0') break;
    pcVar16 = pcVar16 + 1;
  } while( true );
  local_58 = nVars;
  local_38 = ppVarNames;
  if (iVar4 != 0) {
    fwrite("Mio_ParseFormula(): Different number of opening and closing parentheses ().\n",0x4c,1,
           _stdout);
    return (Vec_Int_t *)0x0;
  }
  sVar5 = strlen(pFormInit);
  pbVar6 = (byte *)malloc(sVar5 + 3);
  sprintf((char *)pbVar6,"(%s)",pFormInit);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  pVVar7->pArray = ppvVar8;
  local_60 = pVVar7;
  pFVar9 = (FILE *)malloc(0x10);
  *(undefined8 *)pFVar9 = 100;
  pcVar16 = (char *)0x190;
  pcVar10 = (char *)malloc(400);
  pFVar9->_IO_read_ptr = pcVar10;
  bVar3 = 0 < local_58;
  local_40 = (long)local_58;
  iVar4 = 1;
  cVar20 = '\x01';
  local_68 = pFVar9;
  local_50 = pbVar6;
LAB_008abc95:
  pVVar7 = local_60;
  pFVar9 = local_68;
  bVar1 = *pbVar6;
  cVar19 = cVar20;
  if (bVar1 < 0x20) {
    if ((bVar1 - 9 < 2) || (bVar1 == 0xd)) goto switchD_008abcb3_caseD_20;
    if (bVar1 != 0) goto switchD_008abcb3_caseD_22;
    goto LAB_008ac56d;
  }
  switch(bVar1) {
  case 0x20:
switchD_008abcb3_caseD_20:
    goto LAB_008ac4b5;
  case 0x21:
    if (cVar20 == '\x02') {
      Vec_IntPush((Vec_Int_t *)local_68,9);
      iVar4 = 3;
      cVar19 = '\x03';
    }
    pcVar16 = (char *)local_68;
    Vec_IntPush((Vec_Int_t *)local_68,10);
    break;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
switchD_008abcb3_caseD_22:
    lVar21 = -0x100000000;
    sVar5 = 0;
    do {
      bVar1 = pbVar6[sVar5];
      uVar17 = (ulong)bVar1;
      if (uVar17 < 0x2c) {
        if ((0xec100002601U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_008abfb6;
        if ((0x10200000000U >> (uVar17 & 0x3f) & 1) != 0) {
          fwrite("Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n"
                 ,0x5a,1,_stdout);
          uVar13 = 0;
          goto LAB_008abfbd;
        }
      }
      if ((bVar1 == 0x5e) || (bVar1 == 0x7c)) goto LAB_008abfb6;
      sVar5 = sVar5 + 1;
      lVar21 = lVar21 + 0x100000000;
    } while( true );
  case 0x26:
  case 0x2a:
  case 0x2b:
    goto switchD_008abcb3_caseD_26;
  case 0x27:
    if (cVar20 != '\x02') {
      sVar5 = 0x49;
      pcVar16 = "Mio_ParseFormula(): No variable is specified before the negation suffix.\n";
      goto LAB_008abd51;
    }
    if (local_60->nSize < 1) {
LAB_008ac6ac:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    pcVar16 = (char *)local_60->pArray;
    uVar13 = local_60->nSize - 1;
    local_60->nSize = uVar13;
    pvVar2 = *(void **)(&((FILE *)pcVar16)->_flags + (ulong)uVar13 * 2);
    if (*(int *)((long)pvVar2 + 4) < 1) {
LAB_008ac6cb:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    **(uint **)((long)pvVar2 + 8) = **(uint **)((long)pvVar2 + 8) ^ 1;
    uVar13 = local_60->nCap;
    if (local_60->nSize == uVar13) {
      if ((int)uVar13 < 0x10) {
        if ((FILE *)pcVar16 == (FILE *)0x0) {
          pcVar16 = (char *)0x80;
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(pcVar16,0x80);
        }
        iVar4 = 0x10;
        pFVar9 = (FILE *)pcVar16;
      }
      else {
        iVar4 = uVar13 * 2;
        if (iVar4 <= (int)uVar13) goto LAB_008ac2f3;
        pFVar9 = (FILE *)((ulong)uVar13 << 4);
        if ((FILE *)pcVar16 == (FILE *)0x0) {
          ppvVar8 = (void **)malloc((size_t)pFVar9);
        }
        else {
          ppvVar8 = (void **)realloc(pcVar16,(size_t)pFVar9);
          pFVar9 = (FILE *)pcVar16;
        }
      }
      pVVar7->pArray = ppvVar8;
      pVVar7->nCap = iVar4;
      pcVar16 = (char *)pFVar9;
    }
LAB_008ac2f3:
    iVar4 = pVVar7->nSize;
    pVVar7->nSize = iVar4 + 1;
    pVVar7->pArray[iVar4] = pvVar2;
    goto LAB_008ac32a;
  case 0x28:
    if (cVar20 == '\x02') {
      Vec_IntPush((Vec_Int_t *)local_68,9);
    }
    iVar4 = 1;
    cVar19 = '\x01';
    pcVar16 = (char *)local_68;
    Vec_IntPush((Vec_Int_t *)local_68,1);
    break;
  case 0x29:
    if (*(int *)&local_68->field_0x4 != 0) {
      while (iVar14 = *(int *)&pFVar9->field_0x4, iVar14 != 0) {
        if (iVar14 < 1) goto LAB_008ac68d;
        *(uint *)&pFVar9->field_0x4 = iVar14 - 1U;
        if (*(int *)(pFVar9->_IO_read_ptr + (ulong)(iVar14 - 1U) * 4) == 1) {
          bVar22 = iVar4 == 4;
          iVar4 = (uint)bVar22 * 2 + 2;
          cVar19 = bVar22 * '\x02' + '\x02';
          goto LAB_008ac330;
        }
        pVVar12 = Mio_ParseFormulaOper
                            ((int *)pcVar16,local_58,pVVar7,
                             *(int *)(pFVar9->_IO_read_ptr + (ulong)(iVar14 - 1U) * 4));
        if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_008ac4cd;
      }
    }
    sVar5 = 0x34;
    pcVar16 = "Mio_ParseFormula(): There is no opening parenthesis\n";
    goto LAB_008abd51;
  case 0x30:
    pFVar9 = (FILE *)malloc(0x10);
    *(undefined8 *)pFVar9 = 0x10;
    pcVar16 = (char *)malloc(0x40);
    pFVar9->_IO_read_ptr = pcVar16;
    pcVar16 = (char *)pFVar9;
    Vec_IntPush((Vec_Int_t *)pFVar9,-1);
    uVar13 = pVVar7->nCap;
    if (pVVar7->nSize == uVar13) {
      if ((int)uVar13 < 0x10) {
        pcVar16 = (char *)pVVar7->pArray;
        if ((FILE *)pcVar16 == (FILE *)0x0) {
          pcVar16 = (char *)0x80;
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(pcVar16,0x80);
        }
        pVVar7->pArray = ppvVar8;
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar13 * 2;
        if (iVar4 <= (int)uVar13) goto LAB_008ac24b;
        pFVar15 = (FILE *)pVVar7->pArray;
        pcVar16 = (char *)((ulong)uVar13 << 4);
        if (pFVar15 == (FILE *)0x0) {
          ppvVar8 = (void **)malloc((size_t)pcVar16);
        }
        else {
          ppvVar8 = (void **)realloc(pFVar15,(size_t)pcVar16);
          pcVar16 = (char *)pFVar15;
        }
        pVVar7->pArray = ppvVar8;
      }
      pVVar7->nCap = iVar4;
    }
LAB_008ac24b:
    iVar4 = pVVar7->nSize;
    pVVar7->nSize = iVar4 + 1;
    pVVar7->pArray[iVar4] = pFVar9;
    iVar4 = 2;
    cVar19 = '\x02';
    if (cVar20 == '\x02') {
      sVar5 = 0x3b;
      pcVar16 = "Mio_ParseFormula(): No operation symbol before constant 0.\n";
      goto LAB_008abd51;
    }
    break;
  case 0x31:
    pFVar9 = (FILE *)malloc(0x10);
    *(undefined8 *)pFVar9 = 0x10;
    pcVar16 = (char *)malloc(0x40);
    pFVar9->_IO_read_ptr = pcVar16;
    pcVar16 = (char *)pFVar9;
    Vec_IntPush((Vec_Int_t *)pFVar9,-2);
    uVar13 = pVVar7->nCap;
    if (pVVar7->nSize == uVar13) {
      if ((int)uVar13 < 0x10) {
        pcVar16 = (char *)pVVar7->pArray;
        if ((FILE *)pcVar16 == (FILE *)0x0) {
          pcVar16 = (char *)0x80;
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(pcVar16,0x80);
        }
        pVVar7->pArray = ppvVar8;
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar13 * 2;
        if (iVar4 <= (int)uVar13) goto LAB_008ac29d;
        pFVar15 = (FILE *)pVVar7->pArray;
        pcVar16 = (char *)((ulong)uVar13 << 4);
        if (pFVar15 == (FILE *)0x0) {
          ppvVar8 = (void **)malloc((size_t)pcVar16);
        }
        else {
          ppvVar8 = (void **)realloc(pFVar15,(size_t)pcVar16);
          pcVar16 = (char *)pFVar15;
        }
        pVVar7->pArray = ppvVar8;
      }
      pVVar7->nCap = iVar4;
    }
LAB_008ac29d:
    iVar4 = pVVar7->nSize;
    pVVar7->nSize = iVar4 + 1;
    pVVar7->pArray[iVar4] = pFVar9;
    iVar4 = 2;
    cVar19 = '\x02';
    if (cVar20 == '\x02') {
      sVar5 = 0x3b;
      pcVar16 = "Mio_ParseFormula(): No operation symbol before constant 1.\n";
      goto LAB_008abd51;
    }
    break;
  default:
    if ((bVar1 != 0x5e) && (bVar1 != 0x7c)) goto switchD_008abcb3_caseD_22;
switchD_008abcb3_caseD_26:
    if (cVar20 == '\x02') {
      if (bVar1 < 0x2b) {
        if ((bVar1 == 0x26) || (bVar1 == 0x2a)) {
          iVar4 = 9;
        }
        else {
LAB_008ac03d:
          iVar4 = 8;
        }
      }
      else {
        if ((bVar1 != 0x2b) && (bVar1 != 0x7c)) goto LAB_008ac03d;
        iVar4 = 7;
      }
      pcVar16 = (char *)local_68;
      Vec_IntPush((Vec_Int_t *)local_68,iVar4);
      iVar4 = 3;
      cVar19 = '\x03';
      break;
    }
    sVar5 = 0x42;
    pcVar16 = "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n";
LAB_008abd51:
    fwrite(pcVar16,sVar5,1,_stdout);
    goto LAB_008abd56;
  }
  goto LAB_008ac330;
LAB_008abfb6:
  uVar13 = (uint)(cVar20 == '\x02');
LAB_008abfbd:
  bVar22 = bVar3;
  if (local_58 < 1) {
    iVar4 = 0;
  }
  else {
    uVar17 = 0;
    local_54 = uVar13;
    do {
      pcVar16 = local_38[uVar17];
      iVar4 = strncmp((char *)pbVar6,pcVar16,sVar5);
      if ((iVar4 == 0) && (sVar11 = strlen(pcVar16), sVar11 == sVar5)) {
        pbVar6 = pbVar6 + (lVar21 >> 0x20);
        uVar18 = uVar17;
        break;
      }
      uVar17 = uVar17 + 1;
      bVar22 = (long)uVar17 < local_40;
      uVar18 = local_48;
    } while (local_48 != uVar17);
    iVar4 = (int)uVar18;
    uVar13 = local_54;
  }
  if (bVar22) {
    if ((char)uVar13 != '\0') {
      Vec_IntPush((Vec_Int_t *)local_68,9);
    }
    pVVar7 = local_60;
    pFVar9 = (FILE *)malloc(0x10);
    *(undefined8 *)pFVar9 = 0x10;
    pcVar16 = (char *)malloc(0x40);
    pFVar9->_IO_read_ptr = pcVar16;
    pcVar16 = (char *)pFVar9;
    Vec_IntPush((Vec_Int_t *)pFVar9,iVar4 * 2);
    uVar13 = pVVar7->nCap;
    if (pVVar7->nSize == uVar13) {
      if ((int)uVar13 < 0x10) {
        pcVar16 = (char *)pVVar7->pArray;
        if ((FILE *)pcVar16 == (FILE *)0x0) {
          pcVar16 = (char *)0x80;
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(pcVar16,0x80);
        }
        pVVar7->pArray = ppvVar8;
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar13 * 2;
        if (iVar4 <= (int)uVar13) goto LAB_008ac317;
        pFVar15 = (FILE *)pVVar7->pArray;
        pcVar16 = (char *)((ulong)uVar13 << 4);
        if (pFVar15 == (FILE *)0x0) {
          ppvVar8 = (void **)malloc((size_t)pcVar16);
        }
        else {
          ppvVar8 = (void **)realloc(pFVar15,(size_t)pcVar16);
          pcVar16 = (char *)pFVar15;
        }
        pVVar7->pArray = ppvVar8;
      }
      pVVar7->nCap = iVar4;
    }
LAB_008ac317:
    iVar4 = pVVar7->nSize;
    pVVar7->nSize = iVar4 + 1;
    pVVar7->pArray[iVar4] = pFVar9;
LAB_008ac32a:
    iVar4 = 2;
    cVar19 = '\x02';
  }
  else {
    pcVar16 = (char *)_stdout;
    fprintf(_stdout,"Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n"
            ,pbVar6);
LAB_008abd56:
    iVar4 = 4;
    cVar19 = '\x04';
  }
LAB_008ac330:
  pVVar7 = local_60;
  pFVar9 = local_68;
  cVar20 = cVar19;
  if (cVar19 != '\x01') {
    if (cVar19 == '\x02') {
      iVar14 = *(int *)&local_68->field_0x4;
      while (iVar14 != 0) {
        if (iVar14 < 1) {
LAB_008ac68d:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
        }
        *(uint *)&pFVar9->field_0x4 = iVar14 - 1U;
        Entry = *(int *)(pFVar9->_IO_read_ptr + (ulong)(iVar14 - 1U) * 4);
        if (Entry != 10) goto LAB_008ac4b0;
        if (pVVar7->nSize < 1) goto LAB_008ac6ac;
        pcVar16 = (char *)pVVar7->pArray;
        uVar13 = pVVar7->nSize - 1;
        pVVar7->nSize = uVar13;
        pvVar2 = *(void **)(&((FILE *)pcVar16)->_flags + (ulong)uVar13 * 2);
        if (*(int *)((long)pvVar2 + 4) < 1) goto LAB_008ac6cb;
        **(uint **)((long)pvVar2 + 8) = **(uint **)((long)pvVar2 + 8) ^ 1;
        uVar13 = pVVar7->nCap;
        if (pVVar7->nSize == uVar13) {
          if ((int)uVar13 < 0x10) {
            if ((FILE *)pcVar16 == (FILE *)0x0) {
              pcVar16 = (char *)0x80;
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pcVar16,0x80);
            }
            iVar14 = 0x10;
            pFVar15 = (FILE *)pcVar16;
          }
          else {
            iVar14 = uVar13 * 2;
            if (iVar14 <= (int)uVar13) goto LAB_008ac46f;
            pFVar15 = (FILE *)((ulong)uVar13 << 4);
            if ((FILE *)pcVar16 == (FILE *)0x0) {
              ppvVar8 = (void **)malloc((size_t)pFVar15);
            }
            else {
              ppvVar8 = (void **)realloc(pcVar16,(size_t)pFVar15);
              pFVar15 = (FILE *)pcVar16;
            }
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = iVar14;
          pcVar16 = (char *)pFVar15;
        }
LAB_008ac46f:
        iVar14 = pVVar7->nSize;
        pVVar7->nSize = iVar14 + 1;
        pVVar7->pArray[iVar14] = pvVar2;
        iVar14 = *(int *)&pFVar9->field_0x4;
      }
    }
    else {
      if (cVar19 == '\x04') {
LAB_008ac56d:
        pbVar6 = local_50;
        pVVar7 = local_60;
        if (cVar19 != '\x04') {
          if (local_60->nSize == 0) {
            pcVar16 = "Mio_ParseFormula(): The input string is empty\n";
            sVar5 = 0x2e;
          }
          else {
            pVVar12 = (Vec_Int_t *)Vec_PtrPop(local_60);
            if (pVVar7->nSize == 0) {
              if (*(int *)&local_68->field_0x4 == 0) {
                if (pbVar6 != (byte *)0x0) {
                  free(pbVar6);
                }
                Vec_PtrFreeP(&local_60);
                Vec_IntFreeP((Vec_Int_t **)&local_68);
                Exp_Reverse(pVVar12);
                return pVVar12;
              }
              pcVar16 = "Mio_ParseFormula(): Something is left in the operation stack\n";
              sVar5 = 0x3d;
            }
            else {
              pcVar16 = "Mio_ParseFormula(): Something is left in the function stack\n";
              sVar5 = 0x3c;
            }
          }
          fwrite(pcVar16,sVar5,1,_stdout);
        }
        if (pbVar6 != (byte *)0x0) {
          free(pbVar6);
        }
        pVVar7 = local_60;
        if (local_60 != (Vec_Ptr_t *)0x0) {
          if (local_60->pArray != (void **)0x0) {
            free(local_60->pArray);
            pVVar7->pArray = (void **)0x0;
          }
          free(pVVar7);
          local_60 = (Vec_Ptr_t *)0x0;
        }
        pFVar9 = local_68;
        if (local_68 == (FILE *)0x0) {
          return (Vec_Int_t *)0x0;
        }
        if (local_68->_IO_read_ptr != (char *)0x0) {
          free(local_68->_IO_read_ptr);
          pFVar9->_IO_read_ptr = (char *)0x0;
        }
LAB_008ac548:
        free(pFVar9);
        return (Vec_Int_t *)0x0;
      }
      iVar14 = *(int *)&local_68->field_0x4;
      while( true ) {
        if (iVar14 < 1) goto LAB_008ac68d;
        uVar13 = iVar14 - 1;
        *(uint *)&pFVar9->field_0x4 = uVar13;
        Entry = *(int *)(pFVar9->_IO_read_ptr + (ulong)uVar13 * 4);
        if (uVar13 == 0) goto LAB_008ac4b0;
        *(uint *)&pFVar9->field_0x4 = iVar14 - 2U;
        iVar14 = *(int *)(pFVar9->_IO_read_ptr + (ulong)(iVar14 - 2U) * 4);
        if (iVar14 < Entry) break;
        pVVar12 = Mio_ParseFormulaOper((int *)pcVar16,local_58,pVVar7,iVar14);
        if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_008ac4cd;
        pcVar16 = (char *)pFVar9;
        Vec_IntPush((Vec_Int_t *)pFVar9,Entry);
        iVar14 = *(int *)&pFVar9->field_0x4;
      }
      Vec_IntPush((Vec_Int_t *)pFVar9,iVar14);
LAB_008ac4b0:
      Vec_IntPush((Vec_Int_t *)pFVar9,Entry);
      pcVar16 = (char *)pFVar9;
    }
  }
LAB_008ac4b5:
  pbVar6 = pbVar6 + 1;
  goto LAB_008abc95;
LAB_008ac4cd:
  fwrite("Mio_ParseFormula(): Unknown operation\n",0x26,1,_stdout);
  if (local_50 != (byte *)0x0) {
    free(local_50);
  }
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (void **)0x0;
    }
    free(pVVar7);
    local_60 = (Vec_Ptr_t *)0x0;
  }
  if (pFVar9 == (FILE *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  if (pFVar9->_IO_read_ptr != (char *)0x0) {
    free(pFVar9->_IO_read_ptr);
    pFVar9->_IO_read_ptr = (char *)0x0;
  }
  goto LAB_008ac548;
}

Assistant:

Vec_Int_t * Mio_ParseFormula( char * pFormInit, char ** ppVarNames, int nVars )
{
    char * pFormula;
    int Man = nVars, * pMan = &Man;
    Vec_Ptr_t * pStackFn;
    Vec_Int_t * pStackOp;
    Vec_Int_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
    int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( stdout, "Mio_ParseFormula(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Vec_PtrAlloc( 100 );
    pStackOp = Vec_IntAlloc( 100 );

    Flag = MIO_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
        case MIO_EQN_SYM_CONST0:
            Vec_PtrPush( pStackFn, Exp_Const0() );  // Cudd_Ref( b0 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 0.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_CONST1:
            Vec_PtrPush( pStackFn, Exp_Const1() );  //  Cudd_Ref( b1 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 1.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_NEG:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
                Flag = MIO_EQN_FLAG_OPER;
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_NEG );
            break;
        case MIO_EQN_SYM_NEGAFT:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {// if there is no variable before NEGAFT, it is an error
                fprintf( stdout, "Mio_ParseFormula(): No variable is specified before the negation suffix.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            else // if ( Flag == PARSE_FLAG_VAR )
                Vec_PtrPush( pStackFn, Exp_Not( (Vec_Int_t *)Vec_PtrPop(pStackFn) ) );
            break;
        case MIO_EQN_SYM_AND:
        case MIO_EQN_SYM_AND2:
        case MIO_EQN_SYM_OR:
        case MIO_EQN_SYM_OR2:
        case MIO_EQN_SYM_XOR:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == MIO_EQN_SYM_AND || *pTemp == MIO_EQN_SYM_AND2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
            else if ( *pTemp == MIO_EQN_SYM_OR || *pTemp == MIO_EQN_SYM_OR2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_OR );
            else //if ( *pTemp == MIO_EQN_SYM_XOR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_XOR );
            Flag = MIO_EQN_FLAG_OPER; 
            break;
        case MIO_EQN_SYM_OPEN:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
//                fprintf( stdout, "Mio_ParseFormula(): An opening parenthesis follows a var without operation sign.\n" ); 
//                Flag = MIO_EQN_FLAG_ERROR; 
//              break; 
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = MIO_EQN_FLAG_START; 
            break;
        case MIO_EQN_SYM_CLOSE:
            if ( Vec_IntSize( pStackOp ) != 0 )
            {
                while ( 1 )
                {
                    if ( Vec_IntSize( pStackOp ) == 0 )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( pStackOp );
                    if ( Oper == MIO_EQN_OPER_MARK )
                        break;

                    // perform the given operation
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                }
            }
            else
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( Flag != MIO_EQN_FLAG_ERROR )
                Flag = MIO_EQN_FLAG_VAR; 
            break;


        default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != MIO_EQN_SYM_AND && pTemp[i] != MIO_EQN_SYM_AND2 && pTemp[i] != MIO_EQN_SYM_OR && pTemp[i] != MIO_EQN_SYM_OR2 && 
                         pTemp[i] != MIO_EQN_SYM_XOR && pTemp[i] != MIO_EQN_SYM_NEGAFT && pTemp[i] != MIO_EQN_SYM_CLOSE; 
                  i++ )
              {
                    if ( pTemp[i] == MIO_EQN_SYM_NEG || pTemp[i] == MIO_EQN_SYM_OPEN )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
              }
            // variable name is found
            fFound = 0;
//            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
            for ( v = 0; v < nVars; v++ )
            {
                pName = ppVarNames[v];
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            }
            if ( !fFound )
            { 
                fprintf( stdout, "Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
/*
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
*/
            if ( Flag == MIO_EQN_FLAG_VAR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );

            Vec_PtrPush( pStackFn, Exp_Var(v) ); // Cudd_Ref( pbVars[v] );
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        }

        if ( Flag == MIO_EQN_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == MIO_EQN_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == MIO_EQN_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( Vec_IntSize( pStackOp ) == 0 )
                    break;
                Oper = Vec_IntPop( pStackOp );
                if ( Oper != MIO_EQN_OPER_NEG )
                {
                    Vec_IntPush( pStackOp, Oper );
                    break;
                }
                else
                {
                      Vec_PtrPush( pStackFn, Exp_Not((Vec_Int_t *)Vec_PtrPop(pStackFn)) );
                }
            }
        else // if ( Flag == MIO_EQN_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( pStackOp ); // the last operation
                if ( Vec_IntSize( pStackOp ) == 0 ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( pStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper2 ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                    Vec_IntPush( pStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( pStackOp, Oper2 );
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != MIO_EQN_FLAG_ERROR )
    {
        if ( Vec_PtrSize(pStackFn) != 0 )
        {    
            gFunc = (Vec_Int_t *)Vec_PtrPop(pStackFn);
            if ( Vec_PtrSize(pStackFn) == 0 )
                if ( Vec_IntSize( pStackOp ) == 0 )
                {
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
                    Vec_PtrFreeP( &pStackFn );
                    Vec_IntFreeP( &pStackOp );
                    return Exp_Reverse(gFunc);
                }
                else
                    fprintf( stdout, "Mio_ParseFormula(): Something is left in the operation stack\n" );
            else
                fprintf( stdout, "Mio_ParseFormula(): Something is left in the function stack\n" );
        }
        else
            fprintf( stdout, "Mio_ParseFormula(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
    Vec_PtrFreeP( &pStackFn );
    Vec_IntFreeP( &pStackOp );
    return NULL;
}